

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

file_conflict * file_create_virtual_dir(archive_write *a,xar_conflict *xar,char *pathname)

{
  file_conflict *file;
  char *pathname_local;
  xar_conflict *xar_local;
  archive_write *a_local;
  
  a_local = (archive_write *)file_new(a,(archive_entry *)0x0);
  if ((file_conflict *)a_local == (file_conflict *)0x0) {
    a_local = (archive_write *)0x0;
  }
  else {
    archive_entry_set_pathname(((file_conflict *)a_local)->entry,pathname);
    archive_entry_set_mode(((file_conflict *)a_local)->entry,0x416d);
    ((file_conflict *)a_local)->field_0x168 = ((file_conflict *)a_local)->field_0x168 & 0xfd | 2;
    ((file_conflict *)a_local)->field_0x168 = ((file_conflict *)a_local)->field_0x168 & 0xfe | 1;
  }
  return (file_conflict *)a_local;
}

Assistant:

static struct file *
file_create_virtual_dir(struct archive_write *a, struct xar *xar,
    const char *pathname)
{
	struct file *file;

	(void)xar; /* UNUSED */

	file = file_new(a, NULL);
	if (file == NULL)
		return (NULL);
	archive_entry_set_pathname(file->entry, pathname);
	archive_entry_set_mode(file->entry, 0555 | AE_IFDIR);

	file->dir = 1;
	file->virtual = 1;

	return (file);
}